

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

void __thiscall MeCab::anon_unknown_0::TaggerImpl::~TaggerImpl(TaggerImpl *this)

{
  pointer pcVar1;
  Lattice *pLVar2;
  ModelImpl *pMVar3;
  
  (this->super_Tagger)._vptr_Tagger = (_func_int **)&PTR_parse_0019d7a0;
  pcVar1 = (this->what_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->what_).field_2) {
    operator_delete(pcVar1);
  }
  (this->lattice_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0019dac8;
  pLVar2 = (this->lattice_).ptr_;
  if (pLVar2 != (Lattice *)0x0) {
    (*pLVar2->_vptr_Lattice[0x27])();
  }
  (this->model_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0019da88;
  pMVar3 = (this->model_).ptr_;
  if (pMVar3 != (ModelImpl *)0x0) {
    (*(pMVar3->super_Model)._vptr_Model[7])();
    return;
  }
  return;
}

Assistant:

TaggerImpl::~TaggerImpl() {}